

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void processInput(string *inpFilePath,int insSz,int stdDev,int readLen,double coverage,
                 string *outFolderPath,bool verbose,uint threads)

{
  pointer psVar1;
  pointer psVar2;
  pointer ptVar3;
  bool bVar4;
  RefVector *__x;
  mapped_type *pmVar5;
  __shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *p_Var7;
  int iVar8;
  int i;
  pointer pRVar9;
  bool verbose_local;
  BamReader br;
  int bpRegion;
  string *local_340;
  vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
  tasks;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  inpRegions;
  __shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_2e0;
  __shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_2d0;
  __shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
  local_2c0;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inpFileTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>_>
  exRegionsTask;
  shared_ptr<transwarp::value_task<bool>_> verboseTask;
  shared_ptr<transwarp::value_task<int>_> bpRegionTask;
  shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_>
  mapTask;
  shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>_>
  refTask;
  shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  regionTask;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  inpRegion;
  RefVector ref;
  __shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_200;
  __shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_1f0;
  __shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_1e0;
  __shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2> local_1d0;
  shared_ptr<_157937eb_> processTask;
  shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outFolderTask;
  string inpIntervalsFilePath;
  string excludeFilePath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  revRefMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  exRegions;
  parallel executor;
  
  INTRA_ALIGN_SCORE = readLen / 2;
  MIN_SC_CLUSTER_SUPPORT = 1;
  if (1 < (int)(coverage / 10.0)) {
    MIN_SC_CLUSTER_SUPPORT = (int)(coverage / 10.0);
  }
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &exRegions._M_t._M_impl.super__Rb_tree_header._M_header;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  MIN_SPLIT_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  MIN_DISC_CLUSTER_SUPPORT = MIN_SC_CLUSTER_SUPPORT;
  verbose_local = verbose;
  local_340 = inpFilePath;
  exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       exRegions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::operator+(&excludeFilePath,outFolderPath,&excludeFileName_abi_cxx11_);
  openExcludeRegions(&excludeFilePath,&exRegions);
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  inpRegions.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator+(&inpIntervalsFilePath,outFolderPath,&inpIntervalFileName_abi_cxx11_);
  openInputIntervals(&inpIntervalsFilePath,&inpRegions);
  BamTools::BamReader::BamReader(&br);
  bVar4 = openInput(local_340,&br);
  if (bVar4) {
    __x = BamTools::BamReader::GetReferenceData(&br);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::vector(&ref,__x);
    BamTools::BamReader::Close(&br);
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &revRefMap._M_t._M_impl.super__Rb_tree_header._M_header;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar8 = 0;
    revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         revRefMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pRVar9 = ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pRVar9 != ref.super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                  _M_impl.super__Vector_impl_data._M_finish; pRVar9 = pRVar9 + 1) {
      BamTools::RefData::RefData((RefData *)&executor,pRVar9);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&revRefMap,(key_type *)&executor);
      *pmVar5 = iVar8;
      iVar8 = iVar8 + 1;
      std::__cxx11::string::~string((string *)&executor);
    }
    for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
      headerOutput(outFolderPath,iVar8);
    }
    bpRegion = stdDev * 3 + insSz;
    transwarp::parallel::parallel(&executor,(ulong)threads);
    ptVar3 = inpRegions.
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tasks.
    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var7 = &(inpRegions.
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        ; psVar1 = tasks.
                   super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        p_Var7 != &ptVar3->
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
        ; p_Var7 = p_Var7 + 1) {
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
      ::_Tuple_impl(&inpRegion.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                    ,p_Var7);
      transwarp::make_value_task<std::tuple<std::__cxx11::string,int,int>&>
                ((transwarp *)&regionTask,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  *)&inpRegion.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                );
      transwarp::make_value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>&>
                ((transwarp *)&refTask,&ref);
      transwarp::
      make_value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>&>
                ((transwarp *)&mapTask,&revRefMap);
      transwarp::make_value_task<int&>((transwarp *)&bpRegionTask,&bpRegion);
      transwarp::make_value_task<bool_const&>((transwarp *)&verboseTask,&verbose_local);
      transwarp::
      make_value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>&>
                ((transwarp *)&exRegionsTask,&exRegions);
      transwarp::make_value_task<std::__cxx11::string_const&>((transwarp *)&inpFileTask,local_340);
      transwarp::make_value_task<std::__cxx11::string_const&>
                ((transwarp *)
                 &outFolderTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,outFolderPath);
      std::
      __shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_2c0,
                     &regionTask.
                      super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      __shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_2d0,
                     &refTask.
                      super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      __shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_2e0,
                     &mapTask.
                      super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::__shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1d0,
                 &bpRegionTask.
                  super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2f0,
                 &verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>);
      std::
      __shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_1e0,
                     &exRegionsTask.
                      super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      __shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_1f0,
                     &inpFileTask.
                      super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      std::
      __shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr(&local_200,
                     &outFolderTask.
                      super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      transwarp::
      make_task<transwarp::consume_type,void(&)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),transwarp::value_task<std::tuple<std::__cxx11::string,int,int>>,transwarp::value_task<std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>>,transwarp::value_task<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>,transwarp::value_task<int>,transwarp::value_task<bool>,transwarp::value_task<std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>>,transwarp::value_task<std::__cxx11::string>,transwarp::value_task<std::__cxx11::string>>
                (&processTask,parallelProcess,&local_2c0,&local_2d0,&local_2e0,&local_1d0,&local_2f0
                 ,&local_1e0,&local_1f0,&local_200);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2e0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2c0._M_refcount);
      std::
      vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
      ::
      emplace_back<std::shared_ptr<transwarp::task_impl<transwarp::consume_type,void(*)(std::tuple<std::__cxx11::string,int,int>const&,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>const&,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>const&,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&),std::tuple<std::__cxx11::string,int,int>,std::vector<BamTools::RefData,std::allocator<BamTools::RefData>>,std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>,int,bool,std::map<std::__cxx11::string,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>>>>,std::__cxx11::string,std::__cxx11::string>>&>
                ((vector<std::shared_ptr<transwarp::task<void>>,std::allocator<std::shared_ptr<transwarp::task<void>>>>
                  *)&tasks,&processTask);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&processTask.super___shared_ptr<_ad2835a3_>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&outFolderTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&inpFileTask.
                  super___shared_ptr<transwarp::value_task<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&exRegionsTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&verboseTask.
                  super___shared_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bpRegionTask.
                  super___shared_ptr<transwarp::value_task<int>,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mapTask.
                  super___shared_ptr<transwarp::value_task<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&refTask.
                  super___shared_ptr<transwarp::value_task<std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&regionTask.
                  super___shared_ptr<transwarp::value_task<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string
                ((string *)
                 &inpRegion.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                );
    }
    for (p_Var6 = &(tasks.
                    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>;
        psVar2 = tasks.
                 super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
        p_Var6 != &psVar1->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 = p_Var6 + 1) {
      std::__shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2> *)&inpRegion,
                 p_Var6);
      (**(code **)(*(long *)inpRegion.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            .super__Tuple_impl<1UL,_int,_int> + 0xe0))
                (inpRegion.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                 .super__Tuple_impl<1UL,_int,_int>,&executor);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &inpRegion.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                );
    }
    for (p_Var6 = &(tasks.
                    super__Vector_base<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 != &psVar2->super___shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>;
        p_Var6 = p_Var6 + 1) {
      std::__shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<transwarp::task<void>,_(__gnu_cxx::_Lock_policy)2> *)&inpRegion,
                 p_Var6);
      (**(code **)(*(long *)inpRegion.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                            .super__Tuple_impl<1UL,_int,_int> + 0x1b8))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &inpRegion.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                );
    }
    std::
    vector<std::shared_ptr<transwarp::task<void>_>,_std::allocator<std::shared_ptr<transwarp::task<void>_>_>_>
    ::~vector(&tasks);
    transwarp::parallel::~parallel(&executor);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::~_Rb_tree(&revRefMap._M_t);
    std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&ref);
  }
  BamTools::BamReader::~BamReader(&br);
  std::__cxx11::string::~string((string *)&inpIntervalsFilePath);
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::~vector(&inpRegions);
  std::__cxx11::string::~string((string *)&excludeFilePath);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>_>
  ::~_Rb_tree(&exRegions._M_t);
  return;
}

Assistant:

void processInput(const std::string &inpFilePath, const int insSz, const int stdDev, const int readLen, const double coverage, const std::string &outFolderPath, const bool verbose, const unsigned int threads)
{
	INTRA_ALIGN_SCORE = readLen / 2;
	MIN_SC_CLUSTER_SUPPORT = MIN_SPLIT_SUPPORT = MIN_DISC_CLUSTER_SUPPORT = std::max(1, (int)(coverage / 10));

	std::map<std::string, std::vector<std::pair<long, long>>> exRegions;
	std::string excludeFilePath = outFolderPath + excludeFileName;
	openExcludeRegions(excludeFilePath, exRegions);

	std::vector<std::tuple<std::string, int, int>> inpRegions;
	std::string inpIntervalsFilePath = outFolderPath + inpIntervalFileName;
	openInputIntervals(inpIntervalsFilePath, inpRegions);

	BamTools::BamReader br;
	if (!openInput(inpFilePath, br))
	{
		return;
	}

	BamTools::RefVector ref = br.GetReferenceData();

	br.Close();

	std::map<std::string, int> revRefMap;

	int refCo = 0;
	for (auto d : ref)
	{
		revRefMap[d.RefName] = refCo;
		refCo++;
	}

	for (int i = 0; i < 3; i++)
		headerOutput(outFolderPath, i);

	int bpRegion = insSz + (3 * stdDev);

	transwarp::parallel executor{threads};

	std::vector<std::shared_ptr<transwarp::task<void>>> tasks;

	for (auto inpRegion : inpRegions)
	{
		auto regionTask = transwarp::make_value_task(inpRegion);
		auto refTask = transwarp::make_value_task(ref);
		auto mapTask = transwarp::make_value_task(revRefMap);
		auto bpRegionTask = transwarp::make_value_task(bpRegion);
		auto verboseTask = transwarp::make_value_task(verbose);
		auto exRegionsTask = transwarp::make_value_task(exRegions);
		auto inpFileTask = transwarp::make_value_task(inpFilePath);
		auto outFolderTask = transwarp::make_value_task(outFolderPath);

		auto processTask = transwarp::make_task(transwarp::consume, parallelProcess, regionTask, refTask, mapTask, bpRegionTask, verboseTask, exRegionsTask, inpFileTask, outFolderTask);

		tasks.emplace_back(processTask);
	}

	for (auto task : tasks)
	{
		task->schedule(executor);
	}

	for (auto task : tasks)
	{
		task->get();
	}
}